

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_ciphersuites.c
# Opt level: O1

mbedtls_ssl_ciphersuite_t * mbedtls_ssl_ciphersuite_from_id(int ciphersuite)

{
  mbedtls_ssl_ciphersuite_t *pmVar1;
  int iVar2;
  
  pmVar1 = ciphersuite_definitions;
  iVar2 = 0xc0ad;
  do {
    if (iVar2 == ciphersuite) {
      return pmVar1;
    }
    iVar2 = pmVar1[1].id;
    pmVar1 = pmVar1 + 1;
  } while (iVar2 != 0);
  return (mbedtls_ssl_ciphersuite_t *)0x0;
}

Assistant:

const mbedtls_ssl_ciphersuite_t *mbedtls_ssl_ciphersuite_from_id(int ciphersuite)
{
    const mbedtls_ssl_ciphersuite_t *cur = ciphersuite_definitions;

    while (cur->id != 0) {
        if (cur->id == ciphersuite) {
            return cur;
        }

        cur++;
    }

    return NULL;
}